

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O3

void __thiscall
slang::ast::Compilation::checkVirtualIfaceInstance(Compilation *this,InstanceSymbol *instance)

{
  group_type_pointer pgVar1;
  undefined4 uVar2;
  value_type_pointer ppVar3;
  ulong uVar4;
  size_t sVar5;
  pointer ppSVar6;
  int *piVar7;
  int iVar8;
  undefined1 auVar9 [16];
  byte bVar10;
  ulong uVar11;
  long lVar12;
  Diagnostic *pDVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  InstanceBodySymbol *pIVar17;
  uchar uVar18;
  uchar uVar19;
  uchar uVar20;
  byte bVar21;
  undefined1 auVar22 [16];
  
  pIVar17 = instance->canonicalBody;
  if (pIVar17 == (InstanceBodySymbol *)0x0) {
    pIVar17 = instance->body;
  }
  auVar9._8_8_ = 0;
  auVar9._0_8_ = pIVar17;
  uVar14 = SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar11 = uVar14 >> ((byte)(this->instanceSideEffectMap).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>_>_>
                            .arrays.groups_size_index & 0x3f);
  uVar2 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar14 & 0xff];
  ppVar3 = (this->instanceSideEffectMap).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>_>_>
           .arrays.elements_;
  uVar4 = (this->instanceSideEffectMap).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>_>_>
          .arrays.groups_size_mask;
  uVar16 = 0;
  do {
    pgVar1 = (this->instanceSideEffectMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>_>_>
             .arrays.groups_ + uVar11;
    bVar10 = pgVar1->m[0xf].n;
    uVar18 = (uchar)uVar2;
    auVar22[0] = -(pgVar1->m[0].n == uVar18);
    uVar19 = (uchar)((uint)uVar2 >> 8);
    auVar22[1] = -(pgVar1->m[1].n == uVar19);
    uVar20 = (uchar)((uint)uVar2 >> 0x10);
    auVar22[2] = -(pgVar1->m[2].n == uVar20);
    bVar21 = (byte)((uint)uVar2 >> 0x18);
    auVar22[3] = -(pgVar1->m[3].n == bVar21);
    auVar22[4] = -(pgVar1->m[4].n == uVar18);
    auVar22[5] = -(pgVar1->m[5].n == uVar19);
    auVar22[6] = -(pgVar1->m[6].n == uVar20);
    auVar22[7] = -(pgVar1->m[7].n == bVar21);
    auVar22[8] = -(pgVar1->m[8].n == uVar18);
    auVar22[9] = -(pgVar1->m[9].n == uVar19);
    auVar22[10] = -(pgVar1->m[10].n == uVar20);
    auVar22[0xb] = -(pgVar1->m[0xb].n == bVar21);
    auVar22[0xc] = -(pgVar1->m[0xc].n == uVar18);
    auVar22[0xd] = -(pgVar1->m[0xd].n == uVar19);
    auVar22[0xe] = -(pgVar1->m[0xe].n == uVar20);
    auVar22[0xf] = -(bVar10 == bVar21);
    for (uVar15 = (uint)(ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe); uVar15 != 0;
        uVar15 = uVar15 - 1 & uVar15) {
      iVar8 = 0;
      if (uVar15 != 0) {
        for (; (uVar15 >> iVar8 & 1) == 0; iVar8 = iVar8 + 1) {
        }
      }
      if (pIVar17 ==
          *(InstanceBodySymbol **)((long)&ppVar3[uVar11 * 0xf].first + (ulong)(uint)(iVar8 << 4))) {
        lVar12 = *(long *)((long)&ppVar3[uVar11 * 0xf].second._M_t.
                                  super___uniq_ptr_impl<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_slang::ast::Compilation::InstanceSideEffects_*,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>
                                  .
                                  super__Head_base<0UL,_slang::ast::Compilation::InstanceSideEffects_*,_false>
                                  ._M_head_impl + (ulong)(uint)(iVar8 << 4));
        if (*(long *)(lVar12 + 0x18) != *(long *)(lVar12 + 0x20)) {
          pDVar13 = Scope::addDiag(&pIVar17->super_Scope,(DiagCode)0x21000d,
                                   (instance->super_InstanceSymbolBase).super_Symbol.location);
          Diagnostic::addNote(pDVar13,(DiagCode)0x28000d,
                              *(SourceRange *)(*(long *)(**(long **)(lVar12 + 0x18) + 8) + 0x20));
        }
        goto LAB_0013fc4b;
      }
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar14 & 7] & bVar10) == 0) break;
    lVar12 = uVar11 + uVar16;
    uVar16 = uVar16 + 1;
    uVar11 = lVar12 + 1U & uVar4;
  } while (uVar16 <= uVar4);
LAB_0013fc4b:
  if ((pIVar17->super_Scope).deferredMemberIndex != Invalid) {
    Scope::elaborate(&pIVar17->super_Scope);
  }
  sVar5 = (pIVar17->portList)._M_extent._M_extent_value;
  if (sVar5 != 0) {
    ppSVar6 = (pIVar17->portList)._M_ptr;
    lVar12 = 0;
    pDVar13 = (Diagnostic *)0x0;
    do {
      piVar7 = *(int **)((long)ppSVar6 + lVar12);
      if (*piVar7 == 0x2b) {
        if (pDVar13 == (Diagnostic *)0x0) {
          pDVar13 = Scope::addDiag(&pIVar17->super_Scope,(DiagCode)0x22000d,
                                   (instance->super_InstanceSymbolBase).super_Symbol.location);
        }
        Diagnostic::addNote(pDVar13,(DiagCode)0x50001,*(SourceLocation *)(piVar7 + 6));
      }
      lVar12 = lVar12 + 8;
    } while (sVar5 << 3 != lVar12);
  }
  return;
}

Assistant:

void Compilation::checkVirtualIfaceInstance(const InstanceSymbol& instance) {
    auto body = instance.getCanonicalBody();
    if (!body)
        body = &instance.body;

    if (auto it = instanceSideEffectMap.find(body); it != instanceSideEffectMap.end()) {
        auto& upwardNames = it->second->upwardNames;
        if (!upwardNames.empty()) {
            auto& diag = body->addDiag(diag::VirtualIfaceHierRef, instance.location);
            diag.addNote(diag::NoteHierarchicalRef, upwardNames[0]->expr->sourceRange);
        }
    }

    Diagnostic* portDiag = nullptr;
    for (auto port : body->getPortList()) {
        if (port->kind == SymbolKind::InterfacePort) {
            if (!portDiag)
                portDiag = &body->addDiag(diag::VirtualIfaceIfacePort, instance.location);
            portDiag->addNote(diag::NoteDeclarationHere, port->location);
        }
    }
}